

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreFind.h
# Opt level: O3

bool __thiscall
axl::sl::
BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
::setPattern(BoyerMooreTextFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
             *this,StringRef_utf32 *pattern)

{
  size_t count;
  bool bVar1;
  wchar_t wVar2;
  size_t sVar3;
  wchar_t *pattern_00;
  wchar_t *pwVar4;
  size_t sVar5;
  
  count = pattern->m_length;
  sVar3 = Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::copyReverse
                    ((Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)this,pattern->m_p,count);
  if (sVar3 != 0) {
    bVar1 = Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>::ensureExclusive
                      ((Array<wchar_t,_axl::sl::ArrayDetails<wchar_t>_> *)this);
    pattern_00 = (this->
                 super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
                 ).m_pattern.super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_p;
    pwVar4 = (wchar_t *)0x0;
    if (bVar1) {
      pwVar4 = pattern_00;
    }
    if (count != 0) {
      sVar5 = 0;
      do {
        wVar2 = enc::toCaseFolded(pwVar4[sVar5]);
        pwVar4[sVar5] = wVar2;
        sVar5 = sVar5 + 1;
      } while (count != sVar5);
      pattern_00 = (this->
                   super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
                   ).m_pattern.super_ArrayRef<wchar_t,_axl::sl::ArrayDetails<wchar_t>_>.m_p;
    }
    BoyerMooreSkipTablesBase<wchar_t>::build
              (&(this->
                super_BoyerMooreFindBase<axl::sl::BoyerMooreTextDetailsBase<axl::sl::BoyerMooreSkipTablesBase<wchar_t>,_axl::enc::Utf8,_axl::enc::Utf8ReverseDecoder,_true,_axl::enc::ToCaseFolded,_true,_false,_256UL,_256UL>_>
                ).m_skipTables,pattern_00,count,0x100);
  }
  return sVar3 != 0;
}

Assistant:

bool
	setPattern(const sl::StringRef_utf32& pattern) {
		size_t length = pattern.getLength();
		bool result = IsReverse ?
			this->m_pattern.copyReverse(pattern.cp(), length) :
			this->m_pattern.copy(pattern.cp(), length);

		if (!result)
			return false;

		if (IsCaseFolded) {
			typename Array<typename Details::C>::Rwi rwi = this->m_pattern;
			for (size_t i = 0; i < length; i++)
				rwi[i] = CaseOp()(rwi[i]);
		}

		this->m_skipTables.build(this->m_pattern, length, Details::BadSkipTableSize);
		return true;
	}